

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O2

void __thiscall
txreconciliation_tests::IsPeerRegisteredTest::test_method(IsPeerRegisteredTest *this)

{
  long lVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  assertion_result *paVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  check_type cVar9;
  char **ppcVar7;
  char *pcVar8;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined1 *local_88;
  char **local_80;
  assertion_result local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  TxReconciliationTracker tracker;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TxReconciliationTracker::TxReconciliationTracker(&tracker,1);
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x49;
  file.m_begin = (iterator)&local_50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  bVar2 = TxReconciliationTracker::IsPeerRegistered(&tracker,0);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!tracker.IsPeerRegistered(peer_id0)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_b0 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  local_80 = &local_a8;
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,2,0,WARN,_cVar9,(size_t)&local_b8,0x49);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  TxReconciliationTracker::PreRegisterPeer(&tracker,0);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x4b;
  file_00.m_begin = (iterator)&local_c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d8,msg_00
            );
  bVar2 = TxReconciliationTracker::IsPeerRegistered(&tracker,0);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!tracker.IsPeerRegistered(peer_id0)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_e0 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,2,0,WARN,_cVar9,(size_t)&local_e8,0x4b);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x4d;
  file_01.m_begin = (iterator)&local_f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_108,
             msg_01);
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (char **)0xc694e1;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_110 = "";
  local_78._0_4_ = TxReconciliationTracker::RegisterPeer(&tracker,0,true,1,1);
  paVar6 = &local_78;
  local_a8 = (char *)CONCAT44(local_a8._4_4_,1);
  pcVar8 = "ReconciliationRegisterResult::SUCCESS";
  pvVar4 = (iterator)0x2;
  ppcVar7 = &local_a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
            (&local_98,&local_118,0x4d);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)paVar6;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x4e;
  file_02.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_138,
             msg_02);
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)TxReconciliationTracker::IsPeerRegistered(&tracker,0);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "tracker.IsPeerRegistered(peer_id0)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_140 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_80 = &local_a8;
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,(check_type)ppcVar7,(size_t)&local_148,0x4e,pcVar8);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  TxReconciliationTracker::ForgetPeer(&tracker,0);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_168,
             msg_03);
  bVar2 = TxReconciliationTracker::IsPeerRegistered(&tracker,0);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!tracker.IsPeerRegistered(peer_id0)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_170 = "";
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,(check_type)ppcVar7,(size_t)&local_178,0x51);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  TxReconciliationTracker::~TxReconciliationTracker(&tracker);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPeerRegisteredTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    NodeId peer_id0 = 0;

    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));
    tracker.PreRegisterPeer(peer_id0);
    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));

    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(peer_id0, true, 1, 1), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(peer_id0));

    tracker.ForgetPeer(peer_id0);
    BOOST_CHECK(!tracker.IsPeerRegistered(peer_id0));
}